

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_get_container_id(OPEN_HANDLE open,char **container_id_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  OPEN_INSTANCE *open_instance;
  uint32_t item_count;
  int result;
  char **container_id_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x457;
  }
  else {
    _item_count = container_id_value;
    container_id_value_local = (char **)open;
    iVar1 = amqpvalue_get_composite_item_count(open->composite_value,(uint32_t *)&open_instance);
    if (iVar1 == 0) {
      if ((int)open_instance == 0) {
        open_instance._4_4_ = 0x465;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(open->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          open_instance._4_4_ = 0x46d;
        }
        else {
          iVar1 = amqpvalue_get_string(value,_item_count);
          if (iVar1 == 0) {
            open_instance._4_4_ = 0;
          }
          else {
            open_instance._4_4_ = 0x474;
          }
        }
      }
    }
    else {
      open_instance._4_4_ = 0x45f;
    }
  }
  return open_instance._4_4_;
}

Assistant:

int open_get_container_id(OPEN_HANDLE open, const char** container_id_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_string(item_value, container_id_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}